

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bacNtk.c
# Opt level: O1

void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *p,Vec_Int_t *vMap)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  int iVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  uint uVar12;
  int i;
  long lVar13;
  long lVar14;
  long lVar15;
  
  if ((p->vName).pArray == (int *)0x0) {
    iVar5 = (p->vType).nCap;
    lVar14 = (long)iVar5;
    if (lVar14 == 0) {
      __assert_fail("Bac_NtkObjNumAlloc(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                    ,0xfc,"void Bac_NtkStartNames(Bac_Ntk_t *)");
    }
    if ((p->vName).nCap < iVar5) {
      piVar7 = (int *)malloc(lVar14 * 4);
      (p->vName).pArray = piVar7;
      if (piVar7 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (p->vName).nCap = iVar5;
    }
    if (0 < iVar5) {
      memset((p->vName).pArray,0,lVar14 << 2);
    }
    (p->vName).nSize = iVar5;
  }
  uVar3 = Bac_ManAssignCountNames(p);
  uVar12 = uVar3;
  if (1 < uVar3) {
    uVar12 = 0;
    uVar3 = uVar3 - 1;
    if (uVar3 != 0) {
      do {
        uVar12 = uVar12 + 1;
        bVar2 = 9 < uVar3;
        uVar3 = uVar3 / 10;
      } while (bVar2);
    }
  }
  if (0 < (p->vType).nSize) {
    lVar14 = 0;
    do {
      uVar3 = (uint)(byte)(p->vType).pArray[lVar14];
      if ((uVar3 < 10) && ((0x30cU >> (uVar3 & 0x1f) & 1) != 0)) {
        if ((p->vName).nSize <= lVar14) goto LAB_003ba700;
        if ((p->vName).pArray[lVar14] != 0) {
          uVar3 = Bac_ObjName(p,(int)lVar14);
          if ((int)uVar3 < 0) goto LAB_003ba6e1;
          if (vMap->nSize <= (int)(uVar3 >> 2)) goto LAB_003ba6c2;
          vMap->pArray[uVar3 >> 2] = 1;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vType).nSize);
  }
  if (0 < (p->vType).nSize) {
    lVar14 = 0;
    do {
      bVar1 = (p->vType).pArray[lVar14];
      if (0xffffffbb < (bVar1 >> 1) - 0x49) {
        if ((bVar1 & 0xfc) == 4) goto LAB_003ba75d;
        if ((p->vName).nSize <= lVar14) goto LAB_003ba700;
        if ((p->vName).pArray[lVar14] != 0) {
          uVar3 = Bac_ObjName(p,(int)lVar14);
          if ((int)uVar3 < 0) goto LAB_003ba6e1;
          if (vMap->nSize <= (int)(uVar3 >> 2)) goto LAB_003ba6c2;
          vMap->pArray[uVar3 >> 2] = 1;
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vType).nSize);
  }
  uVar3 = (p->vType).nSize;
  uVar10 = (ulong)uVar3;
  if (0 < (int)uVar3) {
    iVar5 = -1;
    iVar8 = 1;
    lVar15 = 1;
    lVar14 = 0;
LAB_003b9fae:
    iVar4 = (int)uVar10;
    pcVar9 = (p->vType).pArray;
    bVar1 = pcVar9[lVar14];
    if ((9 < bVar1) || ((0x30cU >> (bVar1 & 0x1f) & 1) == 0)) goto LAB_003ba1c6;
    if ((p->vName).nSize <= lVar14) goto LAB_003ba700;
    if ((p->vName).pArray[lVar14] != 0) {
      iVar5 = -1;
      goto LAB_003ba1c6;
    }
    if (bVar1 < 10) {
      i = (int)lVar14;
      if ((bVar1 & 1) == 0) {
        lVar13 = lVar15;
        lVar11 = lVar14;
        if ((bVar1 & 0xfe) != 2) {
          if ((bVar1 & 0xfe) != 8) {
            __assert_fail("Bac_ObjIsBo(p, i) && !Bac_ObjBit(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x13a,"int Bac_BoxBoRange(Bac_Ntk_t *, int)");
          }
LAB_003ba01b:
          if ((int)lVar13 < iVar4) {
            bVar1 = pcVar9[lVar13];
            if ((bVar1 & 0xfe) != 8) {
              pcVar9 = "n";
LAB_003ba11c:
              iVar5 = (int)lVar13;
              goto LAB_003ba11e;
            }
            if (-1 < (char)bVar1) goto code_r0x003ba03e;
            goto LAB_003ba71f;
          }
          pcVar9 = "n";
          iVar5 = iVar4;
          goto LAB_003ba11e;
        }
        do {
          if (iVar4 <= (int)lVar13) {
            pcVar9 = "i";
            iVar5 = iVar4;
            goto LAB_003ba11e;
          }
          bVar1 = pcVar9[lVar13];
          if ((bVar1 & 0xfe) != 2) {
            pcVar9 = "i";
            goto LAB_003ba11c;
          }
          if ((char)bVar1 < '\0') goto LAB_003ba71f;
          lVar11 = lVar11 + 1;
          iVar5 = (int)lVar11;
          lVar13 = lVar13 + 1;
        } while ((bVar1 & 1) != 0);
        pcVar9 = "i";
        goto LAB_003ba11e;
      }
      if (iVar5 < 1) {
        __assert_fail("iBit > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                      ,0x148,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
      }
      iVar4 = Bac_ObjName(p,i);
      if (iVar4 == 0) {
        if (lVar14 < (p->vType).nSize) {
          if (((p->vType).pArray[lVar14] & 0xfcU) != 4) {
            Vec_IntSetEntry(&p->vName,i,iVar5 * 4 + 3);
            iVar5 = iVar5 + 1;
            goto LAB_003ba1c6;
          }
          goto LAB_003ba77c;
        }
        goto LAB_003ba73e;
      }
      goto LAB_003ba77c;
    }
    goto LAB_003ba79b;
  }
LAB_003ba1d9:
  if (4 < (p->vInfo).nSize + 2U) {
    iVar5 = (p->vInfo).nSize;
    uVar3 = 0;
    iVar8 = 0;
    if (2 < iVar5) {
      lVar14 = 0;
      lVar15 = 0;
      uVar10 = 0;
      uVar3 = 0;
      do {
        if (iVar5 <= lVar14) goto LAB_003ba700;
        uVar12 = (p->vInfo).pArray[lVar14];
        if ((int)uVar12 < 0) goto LAB_003ba684;
        uVar12 = uVar12 & 3;
        if (uVar12 == 2) {
          if ((p->vOutputs).nSize <= (int)uVar10) goto LAB_003ba700;
          iVar5 = (p->vOutputs).pArray[uVar10];
          lVar13 = (long)iVar5;
          if ((lVar13 < 0) || ((p->vType).nSize <= iVar5)) goto LAB_003ba73e;
          bVar1 = (p->vType).pArray[lVar13];
          if (0xffffffbb < (bVar1 >> 1) - 0x49) {
LAB_003ba79b:
            __assert_fail("!Bac_ObjIsBox(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x11b,"int Bac_ObjBit(Bac_Ntk_t *, int)");
          }
          if ((char)bVar1 < '\0') {
LAB_003ba71f:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                          ,0x130,"int Abc_LitIsCompl(int)");
          }
          if ((bVar1 & 1) != 0) {
            __assert_fail("!Bac_ObjBit(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                          ,0x168,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          if ((bVar1 & 0x7c) != 4) {
            __assert_fail("Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,0x11d,"int Bac_ObjFanin(Bac_Ntk_t *, int)");
          }
          if ((p->vFanin).nSize <= iVar5) goto LAB_003ba700;
          iVar5 = (p->vFanin).pArray[lVar13];
          uVar12 = Bac_ObjName(p,iVar5);
          if (uVar12 == 0) goto LAB_003ba6a3;
          if ((int)uVar12 < 0) goto LAB_003ba684;
          if ((uVar12 & 2) != 0) {
            __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                          ,0x16a,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar12 = Bac_ObjName(p,iVar5);
          if ((int)uVar12 < 0) goto LAB_003ba6e1;
          if ((p->vInfo).nSize <= lVar14) goto LAB_003ba6c2;
          piVar7 = (p->vInfo).pArray;
          piVar7[lVar14] = uVar12 & 0x7ffffffc | 2;
          if ((p->vInfo).nSize <= lVar14) goto LAB_003ba7ba;
          if (piVar7[lVar14 + 1] < 0) {
            iVar5 = 1;
          }
          else {
            iVar8 = piVar7[lVar14 + 2] - piVar7[lVar14 + 1];
            iVar5 = -iVar8;
            if (0 < iVar8) {
              iVar5 = iVar8;
            }
            iVar5 = iVar5 + 1;
          }
          uVar10 = (ulong)(uint)((int)uVar10 + iVar5);
        }
        else {
          if (uVar12 != 1) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                          ,0x16e,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          if ((p->vInputs).nSize <= (int)uVar3) goto LAB_003ba700;
          iVar5 = (p->vInputs).pArray[uVar3];
          if (((long)iVar5 < 0) || ((p->vType).nSize <= iVar5)) goto LAB_003ba73e;
          bVar1 = (p->vType).pArray[iVar5];
          if (0xffffffbb < (bVar1 >> 1) - 0x49) goto LAB_003ba79b;
          if ((char)bVar1 < '\0') goto LAB_003ba71f;
          if ((bVar1 & 1) != 0) {
            __assert_fail("!Bac_ObjBit(p, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                          ,0x160,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar12 = Bac_ObjName(p,iVar5);
          if (uVar12 == 0) goto LAB_003ba6a3;
          if ((int)uVar12 < 0) goto LAB_003ba684;
          if ((uVar12 & 2) != 0) {
            __assert_fail("Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                          ,0x161,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
          }
          uVar12 = Bac_ObjName(p,iVar5);
          if ((int)uVar12 < 0) goto LAB_003ba6e1;
          if ((p->vInfo).nSize <= lVar14) goto LAB_003ba6c2;
          piVar7 = (p->vInfo).pArray;
          piVar7[lVar14] = (uVar12 & 0x7ffffffc) + 1;
          if ((p->vInfo).nSize <= lVar14) {
LAB_003ba7ba:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
          }
          if (piVar7[lVar14 + 1] < 0) {
            iVar5 = 1;
          }
          else {
            iVar8 = piVar7[lVar14 + 2] - piVar7[lVar14 + 1];
            iVar5 = -iVar8;
            if (0 < iVar8) {
              iVar5 = iVar8;
            }
            iVar5 = iVar5 + 1;
          }
          uVar3 = uVar3 + iVar5;
        }
        iVar8 = (int)uVar10;
        lVar15 = lVar15 + 1;
        iVar5 = (p->vInfo).nSize;
        lVar14 = lVar14 + 3;
      } while (lVar15 < iVar5 / 3);
    }
    if (uVar3 != (p->vInputs).nSize) {
      __assert_fail("nPis == Bac_NtkPiNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                    ,0x170,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
    if (iVar8 != (p->vOutputs).nSize) {
      __assert_fail("nPos == Bac_NtkPoNum(p)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bacNtk.c"
                    ,0x171,"void Bac_ManAssignInternWordNamesNtk(Bac_Ntk_t *, Vec_Int_t *)");
    }
  }
  uVar3 = (p->vType).nSize;
  if (1 < uVar3) {
    uVar12 = 0;
    uVar6 = uVar3 - 1;
    uVar3 = uVar12;
    if (uVar6 != 0) {
      do {
        uVar3 = uVar12 + 1;
        bVar2 = 9 < uVar6;
        uVar12 = uVar3;
        uVar6 = uVar6 / 10;
      } while (bVar2);
    }
  }
  if (0 < (p->vType).nSize) {
    lVar14 = 0;
    do {
      bVar1 = (p->vType).pArray[lVar14];
      if (0xffffffbb < (bVar1 >> 1) - 0x49) {
        if ((bVar1 & 0xfc) == 4) {
LAB_003ba75d:
          __assert_fail("!Bac_ObjIsCo(p, i)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                        ,0x11f,"int Bac_ObjNameInt(Bac_Ntk_t *, int)");
        }
        if ((p->vName).nSize <= lVar14) {
LAB_003ba700:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
        }
        if ((p->vName).pArray[lVar14] == 0) {
          iVar4 = (int)lVar14;
          iVar5 = Bac_ManAssignInternTwo(p,iVar4,uVar3,"g",vMap);
          iVar8 = Bac_ObjName(p,iVar4);
          if (iVar8 != 0) {
LAB_003ba77c:
            __assert_fail("Bac_ObjName(p, i) == 0 && !Bac_ObjIsCo(p, i)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                          ,300,"void Bac_ObjSetName(Bac_Ntk_t *, int, int)");
          }
          if ((p->vType).nSize <= lVar14) {
LAB_003ba73e:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecStr.h"
                          ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
          }
          if (((p->vType).pArray[lVar14] & 0xfcU) == 4) goto LAB_003ba77c;
          Vec_IntSetEntry(&p->vName,iVar4,iVar5 << 2);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vType).nSize);
  }
  if (0 < (p->vInputs).nSize) {
    lVar14 = 0;
    do {
      iVar5 = (p->vInputs).pArray[lVar14];
      uVar3 = Bac_ObjName(p,iVar5);
      if (uVar3 == 0) {
LAB_003ba6a3:
        __assert_fail("n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/bac/bac.h"
                      ,0x107,"Bac_NameType_t Bac_NameType(int)");
      }
      if ((int)uVar3 < 0) {
LAB_003ba684:
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x13e,"int Abc_Lit2Att2(int)");
      }
      if ((uVar3 & 2) == 0) {
        uVar3 = Bac_ObjName(p,iVar5);
        if ((int)uVar3 < 0) goto LAB_003ba6e1;
        if (vMap->nSize <= (int)(uVar3 >> 2)) goto LAB_003ba6c2;
        vMap->pArray[uVar3 >> 2] = 0;
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 < (p->vInputs).nSize);
  }
  if (0 < (p->vType).nSize) {
    lVar14 = 1;
    lVar15 = 0;
    do {
      if (0xffffffbb < ((byte)(p->vType).pArray[lVar15] >> 1) - 0x49) {
        uVar3 = Bac_ObjName(p,(int)lVar15);
        if ((int)uVar3 < 0) {
LAB_003ba6e1:
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x13d,"int Abc_Lit2Var2(int)");
        }
        if (vMap->nSize <= (int)(uVar3 >> 2)) {
LAB_003ba6c2:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1cb,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
        }
        vMap->pArray[uVar3 >> 2] = 0;
        lVar13 = lVar14;
        if (lVar15 + 1 < (long)(p->vType).nSize) {
          do {
            if (((p->vType).pArray[lVar13] & 0xfeU) != 8) break;
            uVar3 = Bac_ObjName(p,(int)lVar13);
            if (uVar3 == 0) goto LAB_003ba6a3;
            if ((int)uVar3 < 0) goto LAB_003ba684;
            if ((uVar3 & 2) == 0) {
              uVar3 = Bac_ObjName(p,(int)lVar13);
              if ((int)uVar3 < 0) goto LAB_003ba6e1;
              if (vMap->nSize <= (int)(uVar3 >> 2)) goto LAB_003ba6c2;
              vMap->pArray[uVar3 >> 2] = 0;
            }
            lVar13 = lVar13 + 1;
          } while ((int)lVar13 < (p->vType).nSize);
        }
      }
      lVar15 = lVar15 + 1;
      lVar14 = lVar14 + 1;
    } while (lVar15 < (p->vType).nSize);
  }
  return;
code_r0x003ba03e:
  lVar11 = lVar11 + 1;
  iVar5 = (int)lVar11;
  lVar13 = lVar13 + 1;
  if ((bVar1 & 1) == 0) goto code_r0x003ba049;
  goto LAB_003ba01b;
code_r0x003ba049:
  pcVar9 = "n";
LAB_003ba11e:
  iVar4 = Bac_ManAssignInternTwo(p,iVar8,uVar12,pcVar9,vMap);
  uVar3 = iVar4 << 2;
  if (iVar5 - i == 1) {
    iVar5 = Bac_ObjName(p,i);
    if (iVar5 != 0) goto LAB_003ba77c;
    if ((p->vType).nSize <= lVar14) goto LAB_003ba73e;
    if (((p->vType).pArray[lVar14] & 0xfcU) == 4) goto LAB_003ba77c;
  }
  else {
    iVar5 = Bac_ObjName(p,i);
    if (iVar5 != 0) goto LAB_003ba77c;
    if ((p->vType).nSize <= lVar14) goto LAB_003ba73e;
    if (((p->vType).pArray[lVar14] & 0xfcU) == 4) goto LAB_003ba77c;
    uVar3 = uVar3 | 1;
  }
  Vec_IntSetEntry(&p->vName,i,uVar3);
  iVar5 = 1;
  iVar8 = iVar8 + 1;
LAB_003ba1c6:
  lVar14 = lVar14 + 1;
  uVar10 = (ulong)(p->vType).nSize;
  lVar15 = lVar15 + 1;
  if ((long)uVar10 <= lVar14) goto LAB_003ba1d9;
  goto LAB_003b9fae;
}

Assistant:

void Bac_ManAssignInternWordNamesNtk( Bac_Ntk_t * p, Vec_Int_t * vMap )
{
    int k, iObj, iTerm, iName = -1, iBit = -1;
    int nDigits, nPis = 0, nPos = 0, nNames = 1;
    // start names
    if ( !Bac_NtkHasNames(p) )
        Bac_NtkStartNames(p);
    nDigits = Abc_Base10Log( Bac_ManAssignCountNames(p) );
    // populate map with the currently used names
    Bac_NtkForEachCi( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    Bac_NtkForEachBox( p, iObj )
        if ( Bac_ObjNameInt(p, iObj) )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 1 );
    // assign CI names
    Bac_NtkForEachCi( p, iObj )
    {
        if ( Bac_ObjNameInt(p, iObj) )
        {
            iName = -1;
            iBit = -1;
            continue;
        }
        if ( Bac_ObjBit(p, iObj) )
        {
            assert( iBit > 0 );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iBit++, BAC_NAME_INDEX) );
        }
        else
        {
            //int Type = Bac_ObjType(p, iObj);
            int Range = Bac_ObjIsPi(p, iObj) ? Bac_ObjPiRange(p, iObj) : Bac_BoxBoRange(p, iObj);
            iName = Bac_ManAssignInternTwo( p, nNames++, nDigits, (char*)(Bac_ObjIsPi(p, iObj) ? "i":"n"), vMap );
            if ( Range == 1 )
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
            else
                Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_WORD) );
            iBit = 1;
        }
    }
    // transfer names to the interface
    if ( Bac_NtkInfoNum(p) )
    {
        for ( k = 0; k < Bac_NtkInfoNum(p); k++ )
        {
            //char * pName = Bac_NtkName(p);
            if ( Bac_NtkInfoType(p, k) == 1 ) // PI
            {
                iObj = Bac_NtkPi(p, nPis);
                assert( !Bac_ObjBit(p, iObj) );
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 1) );
                nPis += Bac_NtkInfoRange(p, k);
            }
            else if ( Bac_NtkInfoType(p, k) == 2 ) // PO
            {
                iObj = Bac_NtkPo(p, nPos);
                assert( !Bac_ObjBit(p, iObj) );
                iObj = Bac_ObjFanin(p, iObj);
                assert( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD );
                Bac_NtkSetInfoName( p, k, Abc_Var2Lit2(Bac_ObjNameId(p, iObj), 2) );
                nPos += Bac_NtkInfoRange(p, k);
            }
            else assert( 0 );
        }
        assert( nPis == Bac_NtkPiNum(p) );
        assert( nPos == Bac_NtkPoNum(p) );
    }
    // assign instance names
    nDigits = Abc_Base10Log( Bac_NtkObjNum(p) );
    Bac_NtkForEachBox( p, iObj )
        if ( !Bac_ObjNameInt(p, iObj) )
        {
            iName = Bac_ManAssignInternTwo( p, iObj, nDigits, "g", vMap );
            Bac_ObjSetName( p, iObj, Abc_Var2Lit2(iName, BAC_NAME_BIN) );
        }
    // unmark all names
    Bac_NtkForEachPi( p, iObj, k )
        if ( Bac_ObjNameType(p, iObj) <= BAC_NAME_WORD )
            Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
    Bac_NtkForEachBox( p, iObj )
    {
        Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iObj), 0 );
        Bac_BoxForEachBo( p, iObj, iTerm, k )
            if ( Bac_ObjNameType(p, iTerm) <= BAC_NAME_WORD )
                Vec_IntWriteEntry( vMap, Bac_ObjNameId(p, iTerm), 0 );
    }
//    printf( "Generated %d word-level names.\n", nNames-1 );
}